

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

void __thiscall
QRhiGles2::beginComputePass
          (QRhiGles2 *this,QRhiCommandBuffer *cb,QRhiResourceUpdateBatch *resourceUpdates,
          BeginPassFlags param_4)

{
  QVarLengthArray<std::function<void_(QRhi_*)>,_4LL> *pQVar1;
  QGles2CommandBuffer *in_RDX;
  QRhiGles2 *in_RSI;
  QGles2CommandBuffer *in_RDI;
  QGles2CommandBuffer *cbD;
  QRhiResourceUpdateBatch *in_stack_00000100;
  QRhiCommandBuffer *in_stack_00000108;
  QRhiGles2 *in_stack_00000110;
  QRhiGles2 *this_00;
  
  this_00 = in_RSI;
  if (in_RDX != (QGles2CommandBuffer *)0x0) {
    enqueueResourceUpdates(in_stack_00000110,in_stack_00000108,in_stack_00000100);
  }
  enqueueBarriersForPass(this_00,in_RDX);
  pQVar1 = &(in_RSI->super_QRhiImplementation).cleanupCallbacks;
  (pQVar1->super_QVLAStorage<32UL,_8UL,_4LL>).array[0x34] = '\x02';
  (pQVar1->super_QVLAStorage<32UL,_8UL,_4LL>).array[0x35] = '\0';
  (pQVar1->super_QVLAStorage<32UL,_8UL,_4LL>).array[0x36] = '\0';
  (pQVar1->super_QVLAStorage<32UL,_8UL,_4LL>).array[0x37] = '\0';
  QGles2CommandBuffer::resetCachedState(in_RDI);
  return;
}

Assistant:

void QRhiGles2::beginComputePass(QRhiCommandBuffer *cb,
                                 QRhiResourceUpdateBatch *resourceUpdates,
                                 QRhiCommandBuffer::BeginPassFlags)
{
    QGles2CommandBuffer *cbD = QRHI_RES(QGles2CommandBuffer, cb);
    Q_ASSERT(cbD->recordingPass == QGles2CommandBuffer::NoPass);

    if (resourceUpdates)
        enqueueResourceUpdates(cb, resourceUpdates);

    enqueueBarriersForPass(cbD);

    cbD->recordingPass = QGles2CommandBuffer::ComputePass;

    cbD->resetCachedState();
}